

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Resize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,int newSize)

{
  HeapAllocator *this_00;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Memory *this_01;
  uint local_80;
  uint local_7c;
  uint i_1;
  uint emptyBuckets;
  EntryType *next;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSStack_68;
  int targetBucket;
  EntryType *current;
  uint i;
  TrackAllocData local_48;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **local_20;
  EntryType **newTable;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *pSStack_10;
  int newSize_local;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  newTable._4_4_ = newSize;
  pSStack_10 = this;
  if ((this->disableResize & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
                       ,0x172,"(!this->disableResize)","!this->disableResize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = this->allocator;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo,0
             ,(long)(int)newTable._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
             ,0x173);
  this_01 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this_00,&local_48);
  local_20 = Memory::
             AllocateArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*,false>
                       (this_01,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,
                        (long)(int)newTable._4_4_);
  for (current._4_4_ = 0; current._4_4_ < this->size; current._4_4_ = current._4_4_ + 1) {
    pSStack_68 = this->table[current._4_4_];
    while (pSStack_68 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0) {
      uVar4 = HashKeyToBucket(this,pSStack_68->key,newTable._4_4_);
      pSVar1 = pSStack_68->next;
      pSStack_68->next = local_20[(int)uVar4];
      local_20[(int)uVar4] = pSStack_68;
      pSStack_68 = pSVar1;
    }
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,(ulong)this->size,this->table);
  this->size = newTable._4_4_;
  this->table = local_20;
  if (this->stats != (DictionaryStats *)0x0) {
    local_7c = 0;
    for (local_80 = 0; local_80 < this->size; local_80 = local_80 + 1) {
      if (this->table[local_80] == (EntryType *)0x0) {
        local_7c = local_7c + 1;
      }
    }
    DictionaryStats::Resize(this->stats,newTable._4_4_,local_7c);
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
        Assert(!this->disableResize);
        EntryType** newTable = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, newSize);

        for (uint i=0; i < size; i++)
        {
            EntryType* current = table[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->key, newSize);
                EntryType* next = current->next; // Cache the next pointer
                current->next = newTable[targetBucket];
                newTable[targetBucket] = current;
                current = next;
            }
        }

        AllocatorDeleteArray(TAllocator, allocator, this->size, this->table);
        this->size = newSize;
        this->table = newTable;
#if PROFILE_DICTIONARY
        if (stats)
        {
            uint emptyBuckets  = 0 ;
            for (uint i=0; i < size; i++)
            {
                if(table[i] == nullptr)
                {
                    emptyBuckets++;
                }
            }
            stats->Resize(newSize, emptyBuckets);
        }
#endif

    }